

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::InsertDebugLabel
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Char *Label,float *pColor,
          int param_3)

{
  string msg;
  string local_28;
  
  if (Label == (Char *)0x0) {
    FormatString<char[23]>(&local_28,(char (*) [23])"Label must not be null");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"InsertDebugLabel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x847);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::InsertDebugLabel(const Char* Label, const float* pColor, int) const
{
    DEV_CHECK_ERR(Label != nullptr, "Label must not be null");
}